

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

size_t PAL_fread(void *buffer,size_t size,size_t count,PAL_FILE *f)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  int nCount;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  
  if (PAL_InitializeChakraCoreCalled) {
    if (f == (PAL_FILE *)0x0) {
      fprintf(_stderr,"] %s %s:%d","PAL_fread",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/file.cpp"
              ,0x1fe);
      fprintf(_stderr,"Expression: f != NULL\n");
    }
    if (f->bTextMode == 1) {
      iVar4 = 0;
      if (count == 0 || size == 0) {
        sVar2 = 0;
      }
      else {
        sVar5 = 0;
        sVar6 = size;
        do {
          iVar1 = PAL_getc(f);
          sVar2 = sVar5;
          if (iVar1 == -1) break;
          lVar3 = (long)iVar4;
          iVar4 = iVar4 + 1;
          *(char *)((long)buffer + lVar3) = (char)iVar1;
          sVar6 = sVar6 - 1;
        } while ((sVar6 != 0) || (sVar5 = sVar5 + 1, sVar2 = count, sVar6 = size, sVar5 != count));
      }
    }
    else {
      sVar2 = fread(buffer,size,count,(FILE *)f->bsdFilePtr);
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return sVar2;
    }
  }
  abort();
}

Assistant:

size_t
__cdecl
PAL_fread(void * buffer, size_t size, size_t count, PAL_FILE * f)
{
    size_t nReadBytes = 0;

    PERF_ENTRY(fread);
    ENTRY( "fread( buffer=%p, size=%d, count=%d, f=%p )\n",
           buffer, size, count, f );

    _ASSERTE(f != NULL);

    CLEARERR(f);

    if(f->bTextMode != TRUE)
    {
        nReadBytes = fread( buffer, size, count, f->bsdFilePtr );
    }
    else
    {
        size_t i=0;
        if(size > 0)
        {
            size_t j=0;
            LPSTR temp = (LPSTR)buffer;
            int nChar = 0;
            int nCount =0;

            for(i=0; i< count; i++)
            {
                for(j=0; j< size; j++)
                {
                    if((nChar = PAL_getc(f)) == EOF)
                    {
                        nReadBytes = i;
                        goto done;
                    }
                    else
                    {
                        temp[nCount++]=nChar;
                    }
                }
            }
        }
        nReadBytes = i;
    }

done:
    LOGEXIT( "fread returning size_t %d\n", nReadBytes );
    PERF_EXIT(fread);
    return nReadBytes;
}